

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Reader * __thiscall
kj::_::NullableValue<capnp::Text::Reader>::emplace<capnp::Text::Reader>
          (NullableValue<capnp::Text::Reader> *this,Reader *params)

{
  Reader *params_00;
  Reader *params_local;
  NullableValue<capnp::Text::Reader> *this_local;
  
  if ((this->isSet & 1U) != 0) {
    this->isSet = false;
    dtor<capnp::Text::Reader>(&(this->field_1).value);
  }
  params_00 = fwd<capnp::Text::Reader>(params);
  ctor<capnp::Text::Reader,capnp::Text::Reader>(&(this->field_1).value,params_00);
  this->isSet = true;
  return (Reader *)&this->field_1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }